

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O3

string * __thiscall
FIX::Dictionary::getString
          (string *__return_storage_ptr__,Dictionary *this,string *key,bool capitalize)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  const_iterator cVar4;
  ConfigError *this_00;
  size_type sVar5;
  string local_50;
  
  string_toUpper(&local_50,key);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->m_data)._M_t,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar4._M_node != &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(cVar4._M_node + 2),
               (long)&(cVar4._M_node[2]._M_parent)->_M_color + *(long *)(cVar4._M_node + 2));
    if ((capitalize) && (sVar1 = __return_storage_ptr__->_M_string_length, sVar1 != 0)) {
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sVar5 = 0;
      do {
        iVar3 = toupper((int)pcVar2[sVar5]);
        pcVar2[sVar5] = (char)iVar3;
        sVar5 = sVar5 + 1;
      } while (sVar1 != sVar5);
    }
    return __return_storage_ptr__;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_50,key," not defined");
  ConfigError::ConfigError(this_00,&local_50);
  __cxa_throw(this_00,&ConfigError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

std::string Dictionary::getString( const std::string& key, bool capitalize ) const
EXCEPT ( ConfigError, FieldConvertError )
{
  Data::const_iterator i = m_data.find(string_toUpper(key));
  if ( i == m_data.end() ) throw ConfigError( key + " not defined" );

  std::string result = i->second;
  if( capitalize )
     std::transform(result.begin(), result.end(), result.begin(), toupper);

  return result;
}